

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable
          (ScalarReplacementPass *this,Instruction *from,Instruction *to,uint32_t member_index)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  DecorationManager *this_00;
  Instruction *this_01;
  Operand *pOVar5;
  uint32_t i;
  pointer ppIVar6;
  pointer ppIVar7;
  initializer_list<unsigned_int> init_list;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_d0;
  uint32_t local_c8;
  uint32_t local_c4;
  ScalarReplacementPass *local_c0;
  pointer local_b8;
  Instruction *local_b0;
  Operand local_a8;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_70
  ;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_b0 = to;
  pIVar4 = GetStorageType(this,from);
  local_c0 = this;
  this_00 = Pass::get_decoration_mgr((Pass *)this);
  uVar2 = Instruction::result_id(pIVar4);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_70,this_00,uVar2,false);
  local_b8 = local_70._M_impl.super__Vector_impl_data._M_finish;
  ppIVar6 = local_70._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = member_index;
  for (ppIVar7 = local_70._M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar6;
      ppIVar7 = ppIVar7 + 1) {
    pIVar4 = *ppIVar7;
    if ((((pIVar4->opcode_ == OpMemberDecorate) &&
         (uVar2 = Instruction::GetSingleWordInOperand(pIVar4,1), uVar2 == member_index)) &&
        (uVar2 = Instruction::GetSingleWordInOperand(pIVar4,2), uVar2 < 0x30)) &&
       ((0xf00000000041U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      this_01 = (Instruction *)::operator_new(0x70);
      local_a8.type = SPV_OPERAND_TYPE_NONE;
      local_a8._4_4_ = 0;
      local_a8.words._vptr_SmallVector = (_func_int **)0x0;
      local_a8.words.size_ = 0;
      Instruction::Instruction
                (this_01,(local_c0->super_MemPass).super_Pass.context_,OpDecorate,0,0,
                 (OperandList *)&local_a8);
      local_d0._M_head_impl = this_01;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_a8);
      _Var1._M_head_impl = local_d0._M_head_impl;
      local_c4 = Instruction::result_id(local_b0);
      init_list._M_len = 1;
      init_list._M_array = &local_c4;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      local_a8.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&(_Var1._M_head_impl)->operands_,&local_a8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      for (uVar2 = 2; uVar3 = Instruction::NumInOperandWords(pIVar4),
          _Var1._M_head_impl = local_d0._M_head_impl, uVar2 < uVar3; uVar2 = uVar2 + 1) {
        pOVar5 = Instruction::GetInOperand(pIVar4,uVar2);
        Operand::Operand(&local_a8,pOVar5);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&(_Var1._M_head_impl)->operands_,&local_a8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
      }
      IRContext::AddAnnotationInst
                ((local_c0->super_MemPass).super_Pass.context_,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_d0);
      member_index = local_c8;
      ppIVar6 = local_b8;
      if (local_d0._M_head_impl != (Instruction *)0x0) {
        (*((local_d0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
        ppIVar6 = local_b8;
      }
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_70);
  return;
}

Assistant:

void ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable(
    Instruction* from, Instruction* to, uint32_t member_index) {
  Instruction* type_inst = GetStorageType(from);
  for (auto dec_inst :
       get_decoration_mgr()->GetDecorationsFor(type_inst->result_id(), false)) {
    uint32_t decoration;
    if (dec_inst->opcode() == spv::Op::OpMemberDecorate) {
      if (dec_inst->GetSingleWordInOperand(1) != member_index) {
        continue;
      }

      decoration = dec_inst->GetSingleWordInOperand(2u);
      switch (spv::Decoration(decoration)) {
        case spv::Decoration::ArrayStride:
        case spv::Decoration::Alignment:
        case spv::Decoration::AlignmentId:
        case spv::Decoration::MaxByteOffset:
        case spv::Decoration::MaxByteOffsetId:
        case spv::Decoration::RelaxedPrecision: {
          std::unique_ptr<Instruction> new_dec_inst(
              new Instruction(context(), spv::Op::OpDecorate, 0, 0, {}));
          new_dec_inst->AddOperand(
              Operand(SPV_OPERAND_TYPE_ID, {to->result_id()}));
          for (uint32_t i = 2; i < dec_inst->NumInOperandWords(); ++i) {
            new_dec_inst->AddOperand(Operand(dec_inst->GetInOperand(i)));
          }
          context()->AddAnnotationInst(std::move(new_dec_inst));
        } break;
        default:
          break;
      }
    }
  }
}